

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O1

Number __thiscall LiteScript::Number::operator/(Number *this,Number *number)

{
  int iVar1;
  char *in_RDX;
  float fVar2;
  float fVar3;
  
  if (number->numeric_type == '\0' && *in_RDX == '\0') {
    if (*(int *)(in_RDX + 4) == 0) {
      fVar2 = nanf("");
      fVar3 = roundf(fVar2);
      if ((fVar3 != fVar2) || (NAN(fVar3) || NAN(fVar2))) {
        this->numeric_type = '\x01';
        (this->value).flotting = fVar2;
        return (Number)this;
      }
      this->numeric_type = '\0';
      iVar1 = (int)fVar2;
    }
    else {
      iVar1 = (number->value).integer / *(int *)(in_RDX + 4);
      this->numeric_type = '\0';
    }
  }
  else {
    fVar2 = (number->value).flotting;
    if (number->numeric_type == '\0') {
      fVar2 = (float)(int)fVar2;
    }
    fVar3 = *(float *)(in_RDX + 4);
    if (*in_RDX == '\0') {
      fVar3 = (float)(int)fVar3;
    }
    fVar2 = fVar2 / fVar3;
    fVar3 = roundf(fVar2);
    if ((fVar3 != fVar2) || (NAN(fVar3) || NAN(fVar2))) {
      this->numeric_type = '\x01';
      (this->value).flotting = fVar2;
      return (Number)this;
    }
    this->numeric_type = '\0';
    iVar1 = (int)fVar2;
  }
  (this->value).integer = iVar1;
  return (Number)this;
}

Assistant:

LiteScript::Number LiteScript::Number::operator/(const LiteScript::Number& number) const {
    if (this->numeric_type == 0 && number.numeric_type == 0) {
        if (number.value.integer == 0)
            return Number(nanf(""));
        else
            return Number(this->value.integer / number.value.integer);
    }
    else
        return Number((float)*this / (float)number);
}